

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O2

int ichol(double *A,int N)

{
  long lVar1;
  double dVar2;
  double *C;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  double dVar17;
  long local_48;
  
  lVar14 = (long)N;
  local_48 = lVar14 * 8;
  C = (double *)malloc(local_48 * lVar14);
  pdVar11 = A + (N + 1);
  pdVar9 = A;
  lVar4 = lVar14;
  lVar12 = lVar14;
  while( true ) {
    lVar12 = lVar12 + -1;
    lVar1 = lVar4 + -1;
    lVar16 = 0;
    if (0 < lVar1) {
      lVar16 = lVar1;
    }
    dVar17 = *pdVar9;
    if (lVar4 == 1) break;
    if (dVar17 < 0.0) {
      iVar13 = -1;
LAB_001356bc:
      uVar5 = 0;
      uVar7 = 0;
      if (0 < N) {
        uVar7 = (ulong)(uint)N;
      }
      for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
        for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
          A[uVar8] = 0.0;
        }
        A = A + lVar14;
      }
      free(C);
      return iVar13;
    }
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    *pdVar9 = dVar17;
    for (lVar3 = 1; lVar3 < lVar4; lVar3 = lVar3 + 1) {
      dVar2 = pdVar9[lVar3];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        pdVar9[lVar3] = dVar2 / dVar17;
      }
    }
    mmult(pdVar9 + 1,pdVar9 + 1,C,(int)lVar1,1,(int)lVar1);
    lVar4 = lVar12;
    pdVar6 = pdVar11;
    pdVar15 = C;
    for (lVar3 = 0; lVar3 != lVar16; lVar3 = lVar3 + 1) {
      for (lVar10 = 0; lVar4 != lVar10; lVar10 = lVar10 + 1) {
        dVar17 = pdVar6[lVar10];
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          pdVar6[lVar10] = dVar17 - pdVar15[lVar10];
        }
      }
      pdVar15 = (double *)((long)pdVar15 + local_48);
      pdVar6 = pdVar6 + lVar14 + 1;
      lVar4 = lVar4 + -1;
    }
    pdVar9 = pdVar9 + lVar14 + 1;
    local_48 = local_48 + -8;
    pdVar11 = pdVar11 + lVar14 + 1;
    lVar4 = lVar1;
  }
  iVar13 = -1;
  if (0.0 < dVar17) {
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    *pdVar9 = dVar17;
    iVar13 = 0;
  }
  goto LAB_001356bc;
}

Assistant:

int ichol(double *A, int N) {
	int sc;
	sc = icholu(A,N);
	return sc;
}